

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O0

void __thiscall nuraft::timer_helper::set_duration_us(timer_helper *this,size_t us)

{
  mutex_type *in_RSI;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[1]._M_device = in_RSI;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x31ed1e);
  return;
}

Assistant:

void set_duration_us(size_t us) {
        std::lock_guard<std::mutex> l(lock_);
        duration_us_ = us;
    }